

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::ReferenceTypename::ReferenceTypename(ReferenceTypename *this,ReferenceTypename *typename_)

{
  pointer pTVar1;
  unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_> local_a8;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_a0 [3];
  optional<enact::Token> local_88;
  optional<enact::Token> local_50;
  ReferenceTypename *local_18;
  ReferenceTypename *typename__local;
  ReferenceTypename *this_local;
  
  local_18 = typename_;
  typename__local = this;
  std::optional<enact::Token>::optional(&local_50,&typename_->m_permission);
  std::optional<enact::Token>::optional(&local_88,&local_18->m_region);
  pTVar1 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&local_18->m_referringTypename);
  (*pTVar1->_vptr_Typename[2])(&local_a8);
  std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
  unique_ptr<enact::Typename,std::default_delete<enact::Typename>,void>
            ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
             local_a0,&local_a8);
  ReferenceTypename(this,&local_50,&local_88,local_a0);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            (local_a0);
  std::unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_>::~unique_ptr(&local_a8);
  std::optional<enact::Token>::~optional(&local_88);
  std::optional<enact::Token>::~optional(&local_50);
  return;
}

Assistant:

ReferenceTypename::ReferenceTypename(const ReferenceTypename& typename_) :
            ReferenceTypename{
                    typename_.m_permission,
                    typename_.m_region,
                    typename_.m_referringTypename->clone()} {
    }